

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPClient.cpp
# Opt level: O0

TCPClient * __thiscall
TCPClient::Send(TCPClient *this,string *hostname,string *portNumber,string *message)

{
  string *in_R8;
  string local_a0 [48];
  string local_70 [32];
  string local_50 [40];
  string *message_local;
  string *portNumber_local;
  string *hostname_local;
  TCPClient *this_local;
  
  message_local = message;
  portNumber_local = portNumber;
  hostname_local = hostname;
  this_local = this;
  std::operator<<((ostream *)&std::cout,"In Linux\n");
  std::__cxx11::string::string(local_50,(string *)portNumber);
  std::__cxx11::string::string(local_70,(string *)message);
  std::__cxx11::string::string(local_a0,in_R8);
  Sendnix(this,hostname,(string *)local_50,(string *)local_70);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return this;
}

Assistant:

string TCPClient::Send(string hostname, string portNumber, string message) {
  // To be used to make it platform independent
  #ifdef __linux__
  std::cout << "In Linux\n";
  #elif _WIN32
  std::cout << "In Windows\n";
  #elif __APPLE__
  std::cout << "Mac Os X\n";
  #else
  std::cout << "Unknown system \n";
  #endif

  // Select the correct platform
  #ifdef __linux__
    return this->Sendnix(hostname, portNumber, message);
  #elif __APPLE__
    return this->Sendnix(hostname, portNumber, message);
  #elif _WIN32
    return this->SendWin(hostname, portNumber, message);
  #endif
}